

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void aom_noise_strength_solver_add_measurement
               (aom_noise_strength_solver_t *solver,double block_mean,double noise_std)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *in_RDI;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  int n;
  double a;
  int bin_i1;
  int bin_i0;
  double bin;
  int local_38;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  aom_noise_strength_solver_t *in_stack_ffffffffffffffe0;
  
  dVar4 = noise_strength_solver_get_bin_index
                    (in_stack_ffffffffffffffe0,
                     (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  dVar5 = floor(dVar4);
  iVar2 = (int)dVar5;
  if ((int)in_RDI[6] + -1 < iVar2 + 1) {
    local_38 = (int)in_RDI[6] + -1;
  }
  else {
    local_38 = iVar2 + 1;
  }
  dVar4 = dVar4 - (double)iVar2;
  iVar1 = (int)in_RDI[6];
  lVar3 = (long)(iVar2 * iVar1 + iVar2);
  *(double *)(*in_RDI + lVar3 * 8) =
       (1.0 - dVar4) * (1.0 - dVar4) + *(double *)(*in_RDI + lVar3 * 8);
  lVar3 = (long)(local_38 * iVar1 + iVar2);
  *(double *)(*in_RDI + lVar3 * 8) = dVar4 * (1.0 - dVar4) + *(double *)(*in_RDI + lVar3 * 8);
  lVar3 = (long)(local_38 * iVar1 + local_38);
  *(double *)(*in_RDI + lVar3 * 8) = dVar4 * dVar4 + *(double *)(*in_RDI + lVar3 * 8);
  lVar3 = (long)(iVar2 * iVar1 + local_38);
  *(double *)(*in_RDI + lVar3 * 8) = dVar4 * (1.0 - dVar4) + *(double *)(*in_RDI + lVar3 * 8);
  *(double *)(in_RDI[1] + (long)iVar2 * 8) =
       (1.0 - dVar4) * in_XMM1_Qa + *(double *)(in_RDI[1] + (long)iVar2 * 8);
  *(double *)(in_RDI[1] + (long)local_38 * 8) =
       dVar4 * in_XMM1_Qa + *(double *)(in_RDI[1] + (long)local_38 * 8);
  in_RDI[7] = (long)(in_XMM1_Qa + (double)in_RDI[7]);
  *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
  return;
}

Assistant:

void aom_noise_strength_solver_add_measurement(
    aom_noise_strength_solver_t *solver, double block_mean, double noise_std) {
  const double bin = noise_strength_solver_get_bin_index(solver, block_mean);
  const int bin_i0 = (int)floor(bin);
  const int bin_i1 = AOMMIN(solver->num_bins - 1, bin_i0 + 1);
  const double a = bin - bin_i0;
  const int n = solver->num_bins;
  solver->eqns.A[bin_i0 * n + bin_i0] += (1.0 - a) * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i0] += a * (1.0 - a);
  solver->eqns.A[bin_i1 * n + bin_i1] += a * a;
  solver->eqns.A[bin_i0 * n + bin_i1] += a * (1.0 - a);
  solver->eqns.b[bin_i0] += (1.0 - a) * noise_std;
  solver->eqns.b[bin_i1] += a * noise_std;
  solver->total += noise_std;
  solver->num_equations++;
}